

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

void __thiscall
ON_Annotation::SetAlternateToleranceResolution
          (ON_Annotation *this,ON_DimStyle *parent_style,int value)

{
  int iVar1;
  ON_DimStyle *pOVar2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  iVar1 = ON_DimStyle::AlternateToleranceResolution(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,iVar1 != value);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetAlternateToleranceResolution(pOVar2,value);
    ON_DimStyle::SetFieldOverride(pOVar2,AltToleranceResolution,iVar1 != value);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetAlternateToleranceResolution(const ON_DimStyle* parent_style, int value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (value != parent_style->AlternateToleranceResolution());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetAlternateToleranceResolution(value);
    override_style->SetFieldOverride(ON_DimStyle::field::AltToleranceResolution, bCreate);
  }
}